

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_cf_movec(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_ptr arg1;
  uint16_t uVar1;
  TCGv_i32 arg2;
  TCGv_i32 local_38;
  TCGv_i32 reg;
  uint16_t ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
  }
  else {
    uVar1 = read_im16(env,s);
    if ((uVar1 & 0x8000) == 0) {
      local_38 = tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar1 >> 0xc & 7)];
    }
    else {
      local_38 = get_areg(s,(int)(uint)uVar1 >> 0xc & 7);
    }
    arg1 = tcg_ctx_00->cpu_env;
    arg2 = tcg_const_i32_m68k(tcg_ctx_00,uVar1 & 0xfff);
    gen_helper_cf_movec_to(tcg_ctx_00,arg1,arg2,local_38);
    gen_exit_tb(s);
  }
  return;
}

Assistant:

DISAS_INSN(cf_movec)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv reg;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }

    ext = read_im16(env, s);

    if (ext & 0x8000) {
        reg = AREG(ext, 12);
    } else {
        reg = DREG(ext, 12);
    }
    gen_helper_cf_movec_to(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, ext & 0xfff), reg);
    gen_exit_tb(s);
}